

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<std::complex<double>_>::TPZVec
          (TPZVec<std::complex<double>_> *this,int64_t size,complex<double> *copy)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  complex<double> *__s;
  long lVar3;
  bool bVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0164ea78;
  this->fStore = (complex<double> *)0x0;
  if (size < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<std::complex<double>>::TPZVec(const int64_t, const T &) [TVar = std::complex<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    this->fNElements = 0;
    this->fNAlloc = 0;
  }
  else {
    if (size != 0) {
      __s = (complex<double> *)operator_new__(-(ulong)((ulong)size >> 0x3c != 0) | size << 4);
      memset(__s,0,size << 4);
      this->fStore = __s;
    }
    this->fNElements = size;
    this->fNAlloc = size;
    lVar3 = 0;
    while (bVar4 = size != 0, size = size + -1, bVar4) {
      uVar2 = *(undefined8 *)(copy->_M_value + 8);
      puVar1 = (undefined8 *)(this->fStore->_M_value + lVar3);
      *puVar1 = *(undefined8 *)copy->_M_value;
      puVar1[1] = uVar2;
      lVar3 = lVar3 + 0x10;
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}